

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feat.c
# Opt level: O0

void feat_print(feat_t *fcb,mfcc_t ***feat,int32 nfr,FILE *fp)

{
  uint32 local_48;
  uint32 local_44;
  uint local_3c;
  uint local_34;
  uint local_30;
  uint32 k;
  uint32 j;
  uint32 i;
  FILE *fp_local;
  int32 nfr_local;
  mfcc_t ***feat_local;
  feat_t *fcb_local;
  
  for (k = 0; k < (uint)nfr; k = k + 1) {
    fprintf((FILE *)fp,"%8d:\n",(ulong)k);
    local_30 = 0;
    while( true ) {
      if (fcb->n_sv == 0) {
        local_3c = fcb->n_stream;
      }
      else {
        local_3c = fcb->n_sv;
      }
      if (local_3c <= local_30) break;
      fprintf((FILE *)fp,"\t%2d:",(ulong)local_30);
      local_34 = 0;
      while( true ) {
        if (fcb->lda == (mfcc_t ***)0x0) {
          if (fcb->sv_len == (uint32 *)0x0) {
            local_48 = fcb->stream_len[local_30];
          }
          else {
            local_48 = fcb->sv_len[local_30];
          }
          local_44 = local_48;
        }
        else {
          local_44 = fcb->out_dim;
        }
        if (local_44 <= local_34) break;
        fprintf((FILE *)fp," %8.4f",(double)(float)feat[k][local_30][local_34]);
        local_34 = local_34 + 1;
      }
      fprintf((FILE *)fp,"\n");
      local_30 = local_30 + 1;
    }
  }
  fflush((FILE *)fp);
  return;
}

Assistant:

void
feat_print(feat_t * fcb, mfcc_t *** feat, int32 nfr, FILE * fp)
{
    uint32 i, j, k;

    for (i = 0; i < nfr; i++) {
        fprintf(fp, "%8d:\n", i);

        for (j = 0; j < feat_dimension1(fcb); j++) {
            fprintf(fp, "\t%2d:", j);

            for (k = 0; k < feat_dimension2(fcb, j); k++)
                fprintf(fp, " %8.4f", MFCC2FLOAT(feat[i][j][k]));
            fprintf(fp, "\n");
        }
    }

    fflush(fp);
}